

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O2

NumberFormat * __thiscall icu_63::NumberFormat::operator=(NumberFormat *this,NumberFormat *rhs)

{
  int32_t iVar1;
  int32_t iVar2;
  
  if (this != rhs) {
    Format::operator=(&this->super_Format,&rhs->super_Format);
    (this->super_Format).field_0x142 = (rhs->super_Format).field_0x142;
    iVar1 = rhs->fMaxFractionDigits;
    iVar2 = rhs->fMinFractionDigits;
    *(undefined8 *)&(this->super_Format).field_0x144 =
         *(undefined8 *)&(rhs->super_Format).field_0x144;
    this->fMaxFractionDigits = iVar1;
    this->fMinFractionDigits = iVar2;
    this->fParseIntegerOnly = rhs->fParseIntegerOnly;
    u_strncpy_63(this->fCurrency,rhs->fCurrency,3);
    this->fCurrency[3] = L'\0';
    this->fLenient = rhs->fLenient;
    this->fCapitalizationContext = rhs->fCapitalizationContext;
  }
  return this;
}

Assistant:

NumberFormat&
NumberFormat::operator=(const NumberFormat& rhs)
{
    if (this != &rhs)
    {
        Format::operator=(rhs);
        fGroupingUsed = rhs.fGroupingUsed;
        fMaxIntegerDigits = rhs.fMaxIntegerDigits;
        fMinIntegerDigits = rhs.fMinIntegerDigits;
        fMaxFractionDigits = rhs.fMaxFractionDigits;
        fMinFractionDigits = rhs.fMinFractionDigits;
        fParseIntegerOnly = rhs.fParseIntegerOnly;
        u_strncpy(fCurrency, rhs.fCurrency, 3);
        fCurrency[3] = 0;
        fLenient = rhs.fLenient;
        fCapitalizationContext = rhs.fCapitalizationContext;
    }
    return *this;
}